

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall cs::structure::~structure(structure *this)

{
  domain_type *pdVar1;
  bool bVar2;
  var *func;
  allocator local_59;
  any local_58;
  any local_50;
  string local_48;
  structure *local_28;
  
  if (this->m_shadow == false) {
    pdVar1 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string((string *)&local_48,"finalize",(allocator *)&local_58);
    bVar2 = domain_type::exist(pdVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar2) {
      pdVar1 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string((string *)&local_48,"finalize",&local_59);
      func = domain_type::get_var(pdVar1,&local_48);
      local_28 = this;
      cs_impl::any::make<cs::structure,cs::structure*>(&local_58,&local_28);
      invoke<cs_impl::any>((cs *)&local_50,func,&local_58);
      cs_impl::any::recycle(&local_50);
      cs_impl::any::recycle(&local_58);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

~structure()
		{
			if (!m_shadow && m_data->exist("finalize"))
				invoke(m_data->get_var("finalize"), var::make<structure>(this));
		}